

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_setb(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  int crf;
  TCGv_i32 tm1;
  TCGv_i32 t8;
  TCGv_i32 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  ret_01 = tcg_temp_new_i32(tcg_ctx_00);
  uVar1 = crfS(ctx->opcode);
  tcg_gen_setcondi_i32_ppc64(tcg_ctx_00,TCG_COND_GEU,ret,cpu_crf[(int)uVar1],4);
  tcg_gen_movi_i32(tcg_ctx_00,ret_00,8);
  tcg_gen_movi_i32(tcg_ctx_00,ret_01,-1);
  tcg_gen_movcond_i32_ppc64(tcg_ctx_00,TCG_COND_GEU,ret,cpu_crf[(int)uVar1],ret_00,ret_01,ret);
  uVar1 = rD(ctx->opcode);
  tcg_gen_ext_i32_i64_ppc64(tcg_ctx_00,cpu_gpr[uVar1],ret);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  tcg_temp_free_i32(tcg_ctx_00,ret_01);
  return;
}

Assistant:

static void gen_setb(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t8 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 tm1 = tcg_temp_new_i32(tcg_ctx);
    int crf = crfS(ctx->opcode);

    tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_GEU, t0, cpu_crf[crf], 4);
    tcg_gen_movi_i32(tcg_ctx, t8, 8);
    tcg_gen_movi_i32(tcg_ctx, tm1, -1);
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_GEU, t0, cpu_crf[crf], t8, tm1, t0);
    tcg_gen_ext_i32_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t0);

    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t8);
    tcg_temp_free_i32(tcg_ctx, tm1);
}